

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::start_hom_clique_proof
          (Proof *this,NamedVertex *p,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *p_clique,NamedVertex *t,
          map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *t_clique_neighbourhood)

{
  _Base_ptr *__y;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar5;
  size_t __n;
  _Base_ptr __n_00;
  pointer ppVar6;
  _Rb_tree_header *p_Var7;
  iterator iVar8;
  int iVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  ostream *poVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var15;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar16;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar17;
  long *t_1;
  long *plVar18;
  bool bVar19;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *q;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  vector<long,_std::allocator<long>_> to_sum;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  pair<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  _Base_ptr local_78;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  long *local_68;
  iterator iStack_60;
  long *local_58;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  _Base_ptr local_38;
  
  ppVar6 = (p_clique->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var15._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_118.first.first._0_8_ =
       *(undefined8 *)
        &((_Var15._M_head_impl)->p_clique).
         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_118.first.first.second._M_dataplus._M_p =
       *(pointer *)((long)&(_Var15._M_head_impl)->p_clique + 8);
  local_118.first.first.second._M_string_length =
       *(size_type *)((long)&(_Var15._M_head_impl)->p_clique + 0x10);
  *(pointer *)
   &((_Var15._M_head_impl)->p_clique).
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       = (p_clique->
         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)&(_Var15._M_head_impl)->p_clique + 8) = ppVar6;
  *(pointer *)((long)&(_Var15._M_head_impl)->p_clique + 0x10) =
       (p_clique->
       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (p_clique->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p_clique->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (p_clique->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_118);
  std::
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=(&((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
               t_clique_neighbourhood,t_clique_neighbourhood);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* hom clique objective\n",0x17);
  local_58 = (long *)0x0;
  local_68 = (long *)0x0;
  iStack_60._M_current = (long *)0x0;
  _Var15._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_120 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)((long)&(_Var15._M_head_impl)->p_clique + 8);
  paVar20 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&((_Var15._M_head_impl)->p_clique).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  if (paVar20 != local_120) {
    do {
      uVar5._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,"u 1 ~x",6);
      local_118.first.first._0_8_ = SEXT48(p->first);
      local_118.first.first.second._M_dataplus._M_p = (pointer)(long)t->first;
      pmVar10 = std::
                map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->variable_mappings,(key_type *)&local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,(pmVar10->_M_dataplus)._M_p,pmVar10->_M_string_length);
      _Var15._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      p_Var11 = *(_Base_ptr *)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 0x18);
      p_Var7 = (_Rb_tree_header *)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 8);
      if ((_Rb_tree_header *)p_Var11 != p_Var7) {
        do {
          uVar5._M_t.
          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     uVar5._M_t.
                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                     ._M_head_impl," 1 x",4);
          local_118.first.first._0_8_ = SEXT48(*(int *)paVar20);
          local_118.first.first.second._M_dataplus._M_p =
               (pointer)(long)*(int *)&p_Var11[1]._M_parent;
          pmVar10 = std::
                    map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                  _M_head_impl)->variable_mappings,(key_type *)&local_118);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     uVar5._M_t.
                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                     ._M_head_impl,(pmVar10->_M_dataplus)._M_p,pmVar10->_M_string_length);
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var7);
        _Var15._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 ((_Var15._M_head_impl)->proof_stream)._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ," >= 1 ;\n",8);
      _Var15._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      lVar12 = (_Var15._M_head_impl)->proof_line + 1;
      (_Var15._M_head_impl)->proof_line = lVar12;
      if (iStack_60._M_current == local_58) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_68,iStack_60,
                   &(_Var15._M_head_impl)->proof_line);
      }
      else {
        *iStack_60._M_current = lVar12;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar20->_M_local_buf + 0x28);
    } while (paVar20 != local_120);
    _Var15._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             ((_Var15._M_head_impl)->proof_stream)._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ,"p",1);
  iVar8._M_current = iStack_60._M_current;
  if (local_68 != iStack_60._M_current) {
    bVar19 = true;
    plVar18 = local_68;
    do {
      uVar5._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      std::ostream::_M_insert<long>
                ((long)uVar5._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl);
      if (!bVar19) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   proof_stream)._M_t," +",2);
      }
      plVar18 = plVar18 + 1;
      bVar19 = false;
    } while (plVar18 != iVar8._M_current);
  }
  local_118.first.first.first._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,(char *)&local_118,1);
  _Var15._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  lVar12 = (_Var15._M_head_impl)->proof_line + 1;
  (_Var15._M_head_impl)->proof_line = lVar12;
  (_Var15._M_head_impl)->objective_line = lVar12;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)((_Var15._M_head_impl)->proof_stream)._M_t,
             "* hom clique non edges for injectivity\n",0x27);
  _Var15._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_1c8 = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)&((_Var15._M_head_impl)->p_clique).
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_48 = *(pointer *)((long)&(_Var15._M_head_impl)->p_clique + 8);
  if (local_1c8 != local_48) {
    paVar1 = &local_1c0.first.second.field_2;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_118.second.second.second + 0x10);
    do {
      _Var15._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      ppVar17 = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&((_Var15._M_head_impl)->p_clique).
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      local_70 = *(pointer *)((long)&(_Var15._M_head_impl)->p_clique + 8);
      if (ppVar17 != local_70) {
        do {
          if (((local_1c8->first != ppVar17->first) ||
              (__n = (local_1c8->second)._M_string_length, __n != (ppVar17->second)._M_string_length
              )) || ((__n != 0 &&
                     (iVar9 = bcmp((local_1c8->second)._M_dataplus._M_p,
                                   (ppVar17->second)._M_dataplus._M_p,__n), iVar9 != 0)))) {
            _Var15._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
            paVar14 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 0x18);
            local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 8);
            if (paVar14 != local_120) {
              do {
                uVar5._M_t.
                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                _M_head_impl = (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           uVar5._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl,"u 1 ~x",6);
                ppVar16 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)paVar14 + 0x28);
                local_118.first.first._0_8_ = SEXT48(local_1c8->first);
                local_118.first.first.second._M_dataplus._M_p = (pointer)(long)ppVar16->first;
                pmVar10 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_118);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     uVar5._M_t.
                                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                     ._M_head_impl,(pmVar10->_M_dataplus)._M_p,
                                     pmVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," 1 ~x",5);
                local_1c0.first._0_8_ = SEXT48(ppVar17->first);
                local_1c0.first.second._M_dataplus._M_p = (pointer)(long)ppVar16->first;
                pmVar10 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_1c0);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(pmVar10->_M_dataplus)._M_p,pmVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," >= 1 ;\n",8);
                _Var15._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                plVar18 = &(_Var15._M_head_impl)->proof_line;
                *plVar18 = *plVar18 + 1;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1c0,local_1c8,ppVar16);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_170,ppVar17,ppVar16);
                local_118.second.second.second._M_string_length =
                     local_170.second.second._M_string_length;
                local_118.second.first.second._M_string_length =
                     local_170.first.second._M_string_length;
                local_118.first.second.second._M_string_length =
                     local_1c0.second.second._M_string_length;
                local_118.first.first.second._M_string_length =
                     local_1c0.first.second._M_string_length;
                local_118.first.first.second._M_dataplus._M_p =
                     (pointer)&local_118.first.first.second.field_2;
                local_118.first.first.first = local_1c0.first.first;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p == paVar1) {
                  local_118.first.first.second.field_2._8_8_ = local_1c0.first.second.field_2._8_8_;
                }
                else {
                  local_118.first.first.second._M_dataplus._M_p =
                       local_1c0.first.second._M_dataplus._M_p;
                }
                local_118.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.first.second.field_2._M_local_buf[0] =
                     local_1c0.first.second.field_2._M_local_buf[0];
                local_1c0.first.second._M_string_length = 0;
                local_1c0.first.second.field_2._M_local_buf[0] = '\0';
                local_118.first.second.second._M_dataplus._M_p =
                     (pointer)((long)&local_118.first.second.second + 0x10);
                local_118.first.second.first = local_1c0.second.first;
                paVar4 = &local_1c0.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p == paVar4) {
                  local_118.first.second.second.field_2._8_8_ =
                       local_1c0.second.second.field_2._8_8_;
                }
                else {
                  local_118.first.second.second._M_dataplus._M_p =
                       local_1c0.second.second._M_dataplus._M_p;
                }
                local_118.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.second.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.second.second.field_2._M_local_buf[0] =
                     local_1c0.second.second.field_2._M_local_buf[0];
                paVar2 = &local_170.first.second.field_2;
                local_1c0.second.second._M_string_length = 0;
                local_1c0.second.second.field_2._M_local_buf[0] = '\0';
                local_118.second.first.first = local_170.first.first;
                local_118.second.first.second._M_dataplus._M_p =
                     (pointer)((long)&local_118.second.first.second + 0x10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p == paVar2) {
                  local_118.second.first.second.field_2._8_8_ = local_170.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_118.second.first.second._M_dataplus._M_p =
                       local_170.first.second._M_dataplus._M_p;
                }
                local_118.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_170.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.second.first.second.field_2._M_local_buf[0] =
                     local_170.first.second.field_2._M_local_buf[0];
                local_170.first.second._M_string_length = 0;
                local_170.first.second.field_2._M_local_buf[0] = '\0';
                local_118.second.second.first = local_170.second.first;
                paVar3 = &local_170.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p == paVar3) {
                  local_118.second.second.second.field_2._8_8_ =
                       local_170.second.second.field_2._8_8_;
                  local_118.second.second.second._M_dataplus._M_p = (pointer)paVar20;
                }
                else {
                  local_118.second.second.second._M_dataplus._M_p =
                       local_170.second.second._M_dataplus._M_p;
                }
                local_118.second.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_170.second.second.field_2._M_allocated_capacity._1_7_;
                local_118.second.second.second.field_2._M_local_buf[0] =
                     local_170.second.second.field_2._M_local_buf[0];
                local_170.second.second._M_string_length = 0;
                local_170.second.second.field_2._M_local_buf[0] = '\0';
                local_1c0.first.second._M_dataplus._M_p = (pointer)paVar1;
                local_1c0.second.second._M_dataplus._M_p = (pointer)paVar4;
                local_170.first.second._M_dataplus._M_p = (pointer)paVar2;
                local_170.second.second._M_dataplus._M_p = (pointer)paVar3;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var15._M_head_impl)->clique_for_hom_non_edge_constraints,&local_118
                           ,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.second.second._M_dataplus._M_p != paVar20) {
                  operator_delete(local_118.second.second.second._M_dataplus._M_p,
                                  local_118.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.first.second._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_118.second.first.second + 0x10U)) {
                  operator_delete(local_118.second.first.second._M_dataplus._M_p,
                                  local_118.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.first.second.second._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_118.first.second.second + 0x10U)) {
                  operator_delete(local_118.first.second.second._M_dataplus._M_p,
                                  local_118.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.first.first.second._M_dataplus._M_p !=
                    &local_118.first.first.second.field_2) {
                  operator_delete(local_118.first.first.second._M_dataplus._M_p,
                                  local_118.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p != &local_170.second.second.field_2)
                {
                  operator_delete(local_170.second.second._M_dataplus._M_p,
                                  CONCAT71(local_170.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p != &local_170.first.second.field_2) {
                  operator_delete(local_170.first.second._M_dataplus._M_p,
                                  CONCAT71(local_170.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p != &local_1c0.second.second.field_2)
                {
                  operator_delete(local_1c0.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1c0.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                _Var15._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1c0,ppVar17,ppVar16);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_170,local_1c8,ppVar16);
                local_118.second.second.second._M_string_length =
                     local_170.second.second._M_string_length;
                local_118.second.first.second._M_string_length =
                     local_170.first.second._M_string_length;
                local_118.first.second.second._M_string_length =
                     local_1c0.second.second._M_string_length;
                local_118.first.first.second._M_string_length =
                     local_1c0.first.second._M_string_length;
                local_118.first.first.second._M_dataplus._M_p =
                     (pointer)&local_118.first.first.second.field_2;
                local_118.first.first.first = local_1c0.first.first;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p == paVar1) {
                  local_118.first.first.second.field_2._8_8_ = local_1c0.first.second.field_2._8_8_;
                }
                else {
                  local_118.first.first.second._M_dataplus._M_p =
                       local_1c0.first.second._M_dataplus._M_p;
                }
                local_118.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.first.second.field_2._M_local_buf[0] =
                     local_1c0.first.second.field_2._M_local_buf[0];
                local_1c0.first.second._M_string_length = 0;
                local_1c0.first.second.field_2._M_local_buf[0] = '\0';
                local_118.first.second.second._M_dataplus._M_p =
                     (pointer)((long)&local_118.first.second.second + 0x10);
                local_118.first.second.first = local_1c0.second.first;
                paVar4 = &local_1c0.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p == paVar4) {
                  local_118.first.second.second.field_2._8_8_ =
                       local_1c0.second.second.field_2._8_8_;
                }
                else {
                  local_118.first.second.second._M_dataplus._M_p =
                       local_1c0.second.second._M_dataplus._M_p;
                }
                local_118.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.second.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.second.second.field_2._M_local_buf[0] =
                     local_1c0.second.second.field_2._M_local_buf[0];
                paVar2 = &local_170.first.second.field_2;
                local_1c0.second.second._M_string_length = 0;
                local_1c0.second.second.field_2._M_local_buf[0] = '\0';
                local_118.second.first.first = local_170.first.first;
                local_118.second.first.second._M_dataplus._M_p =
                     (pointer)((long)&local_118.second.first.second + 0x10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p == paVar2) {
                  local_118.second.first.second.field_2._8_8_ = local_170.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_118.second.first.second._M_dataplus._M_p =
                       local_170.first.second._M_dataplus._M_p;
                }
                local_118.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_170.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.second.first.second.field_2._M_local_buf[0] =
                     local_170.first.second.field_2._M_local_buf[0];
                local_170.first.second._M_string_length = 0;
                local_170.first.second.field_2._M_local_buf[0] = '\0';
                local_118.second.second.first = local_170.second.first;
                paVar3 = &local_170.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p == paVar3) {
                  local_118.second.second.second.field_2._8_8_ =
                       local_170.second.second.field_2._8_8_;
                  local_118.second.second.second._M_dataplus._M_p = (pointer)paVar20;
                }
                else {
                  local_118.second.second.second._M_dataplus._M_p =
                       local_170.second.second._M_dataplus._M_p;
                }
                local_118.second.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_170.second.second.field_2._M_allocated_capacity._1_7_;
                local_118.second.second.second.field_2._M_local_buf[0] =
                     local_170.second.second.field_2._M_local_buf[0];
                local_170.second.second._M_string_length = 0;
                local_170.second.second.field_2._M_local_buf[0] = '\0';
                local_1c0.first.second._M_dataplus._M_p = (pointer)paVar1;
                local_1c0.second.second._M_dataplus._M_p = (pointer)paVar4;
                local_170.first.second._M_dataplus._M_p = (pointer)paVar2;
                local_170.second.second._M_dataplus._M_p = (pointer)paVar3;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var15._M_head_impl)->clique_for_hom_non_edge_constraints,&local_118
                           ,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.second.second._M_dataplus._M_p != paVar20) {
                  operator_delete(local_118.second.second.second._M_dataplus._M_p,
                                  local_118.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.first.second._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_118.second.first.second + 0x10U)) {
                  operator_delete(local_118.second.first.second._M_dataplus._M_p,
                                  local_118.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.first.second.second._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_118.first.second.second + 0x10U)) {
                  operator_delete(local_118.first.second.second._M_dataplus._M_p,
                                  local_118.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)local_118.first.first.second._M_dataplus._M_p !=
                    (pointer)&local_118.first.first.second.field_2) {
                  operator_delete(local_118.first.first.second._M_dataplus._M_p,
                                  local_118.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p != &local_170.second.second.field_2)
                {
                  operator_delete(local_170.second.second._M_dataplus._M_p,
                                  CONCAT71(local_170.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p != &local_170.first.second.field_2) {
                  operator_delete(local_170.first.second._M_dataplus._M_p,
                                  CONCAT71(local_170.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p != &local_1c0.second.second.field_2)
                {
                  operator_delete(local_1c0.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1c0.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar14);
              } while (paVar14 != local_120);
            }
          }
          ppVar17 = ppVar17 + 1;
        } while (ppVar17 != local_70);
      }
      local_1c8 = local_1c8 + 1;
    } while (local_1c8 != local_48);
    _Var15._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             ((_Var15._M_head_impl)->proof_stream)._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ,"* hom clique non edges for variables\n",0x25);
  _Var15._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  ppVar17 = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)&((_Var15._M_head_impl)->p_clique).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_40 = *(pointer *)((long)&(_Var15._M_head_impl)->p_clique + 8);
  if (ppVar17 != local_40) {
    ppVar6 = (pointer)&local_118.first.first.second.field_2;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_118.first.second.second + 0x10);
    local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_118.second.second.second + 0x10);
    do {
      _Var15._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      local_78 = *(_Base_ptr *)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 0x18);
      local_38 = (_Base_ptr)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 8);
      if (local_78 != local_38) {
        do {
          _Var15._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          ppVar16 = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 0x18);
          local_48 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&(_Var15._M_head_impl)->t_clique_neighbourhood + 8);
          if (ppVar16 != local_48) {
            __y = &local_78[1]._M_parent;
            do {
              if (((*(int *)__y != ppVar16[1].first) ||
                  (__n_00 = local_78[1]._M_right,
                  __n_00 != (_Base_ptr)ppVar16[1].second._M_string_length)) ||
                 ((__n_00 != (_Base_ptr)0x0 &&
                  (iVar9 = bcmp(local_78[1]._M_left,ppVar16[1].second._M_dataplus._M_p,
                                (size_t)__n_00), iVar9 != 0)))) {
                uVar5._M_t.
                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                _M_head_impl = (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t;
                local_70 = ppVar16;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           uVar5._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl,"u 1 ~x",6);
                local_118.first.first._0_8_ = SEXT48(ppVar17->first);
                local_118.first.first.second._M_dataplus._M_p = (pointer)(long)*(int *)__y;
                pmVar10 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_118);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     uVar5._M_t.
                                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                     ._M_head_impl,(pmVar10->_M_dataplus)._M_p,
                                     pmVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," 1 ~x",5);
                ppVar16 = local_70 + 1;
                local_1c0.first._0_8_ = SEXT48(ppVar17->first);
                local_1c0.first.second._M_dataplus._M_p = (pointer)(long)ppVar16->first;
                pmVar10 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_1c0);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,(pmVar10->_M_dataplus)._M_p,pmVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," >= 1 ;\n",8);
                _Var15._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                plVar18 = &(_Var15._M_head_impl)->proof_line;
                *plVar18 = *plVar18 + 1;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1c0,ppVar17,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)__y);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_170,ppVar17,ppVar16);
                local_118.second.second.second._M_string_length =
                     local_170.second.second._M_string_length;
                local_118.second.first.second._M_string_length =
                     local_170.first.second._M_string_length;
                local_118.first.second.second._M_string_length =
                     local_1c0.second.second._M_string_length;
                local_118.first.first.second._M_string_length =
                     local_1c0.first.second._M_string_length;
                paVar1 = &local_1c0.first.second.field_2;
                local_118.first.first.first = local_1c0.first.first;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p == paVar1) {
                  local_118.first.first.second.field_2._8_8_ = local_1c0.first.second.field_2._8_8_;
                  local_118.first.first.second._M_dataplus._M_p = (pointer)ppVar6;
                }
                else {
                  local_118.first.first.second._M_dataplus._M_p =
                       local_1c0.first.second._M_dataplus._M_p;
                }
                local_118.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.first.second.field_2._M_local_buf[0] =
                     local_1c0.first.second.field_2._M_local_buf[0];
                local_1c0.first.second._M_string_length = 0;
                local_1c0.first.second.field_2._M_local_buf[0] = '\0';
                local_118.first.second.first = local_1c0.second.first;
                paVar14 = &local_1c0.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p == paVar14) {
                  local_118.first.second.second.field_2._8_8_ =
                       local_1c0.second.second.field_2._8_8_;
                  local_118.first.second.second._M_dataplus._M_p = (pointer)paVar20;
                }
                else {
                  local_118.first.second.second._M_dataplus._M_p =
                       local_1c0.second.second._M_dataplus._M_p;
                }
                local_118.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.second.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.second.second.field_2._M_local_buf[0] =
                     local_1c0.second.second.field_2._M_local_buf[0];
                paVar4 = &local_170.first.second.field_2;
                local_1c0.second.second._M_string_length = 0;
                local_1c0.second.second.field_2._M_local_buf[0] = '\0';
                local_118.second.first.first = local_170.first.first;
                local_118.second.first.second._M_dataplus._M_p =
                     (pointer)((long)&local_118.second.first.second + 0x10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p == paVar4) {
                  local_118.second.first.second.field_2._8_8_ = local_170.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_118.second.first.second._M_dataplus._M_p =
                       local_170.first.second._M_dataplus._M_p;
                }
                local_118.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_170.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.second.first.second.field_2._M_local_buf[0] =
                     local_170.first.second.field_2._M_local_buf[0];
                local_170.first.second._M_string_length = 0;
                local_170.first.second.field_2._M_local_buf[0] = '\0';
                paVar2 = &local_170.second.second.field_2;
                local_118.second.second.first = local_170.second.first;
                local_118.second.second.second._M_dataplus._M_p = (pointer)local_120;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p == paVar2) {
                  local_120->_M_allocated_capacity =
                       CONCAT71(local_170.second.second.field_2._M_allocated_capacity._1_7_,
                                local_170.second.second.field_2._M_local_buf[0]);
                  *(undefined8 *)(local_120->_M_local_buf + 8) =
                       local_170.second.second.field_2._8_8_;
                }
                else {
                  local_118.second.second.second.field_2._M_allocated_capacity =
                       CONCAT71(local_170.second.second.field_2._M_allocated_capacity._1_7_,
                                local_170.second.second.field_2._M_local_buf[0]);
                  local_118.second.second.second._M_dataplus._M_p =
                       local_170.second.second._M_dataplus._M_p;
                }
                local_170.second.second._M_string_length = 0;
                local_170.second.second.field_2._M_local_buf[0] = '\0';
                local_1c0.first.second._M_dataplus._M_p = (pointer)paVar1;
                local_1c0.second.second._M_dataplus._M_p = (pointer)paVar14;
                local_170.first.second._M_dataplus._M_p = (pointer)paVar4;
                local_170.second.second._M_dataplus._M_p = (pointer)paVar2;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var15._M_head_impl)->clique_for_hom_non_edge_constraints,&local_118
                           ,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.second.second._M_dataplus._M_p != local_120) {
                  operator_delete(local_118.second.second.second._M_dataplus._M_p,
                                  local_118.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.first.second._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_118.second.first.second + 0x10U)) {
                  operator_delete(local_118.second.first.second._M_dataplus._M_p,
                                  local_118.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.first.second.second._M_dataplus._M_p != paVar20) {
                  operator_delete(local_118.first.second.second._M_dataplus._M_p,
                                  local_118.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)local_118.first.first.second._M_dataplus._M_p != ppVar6) {
                  operator_delete(local_118.first.first.second._M_dataplus._M_p,
                                  local_118.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p != &local_170.second.second.field_2)
                {
                  operator_delete(local_170.second.second._M_dataplus._M_p,
                                  CONCAT71(local_170.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p != &local_170.first.second.field_2) {
                  operator_delete(local_170.first.second._M_dataplus._M_p,
                                  CONCAT71(local_170.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p != &local_1c0.second.second.field_2)
                {
                  operator_delete(local_1c0.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p != &local_1c0.first.second.field_2) {
                  operator_delete(local_1c0.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                _Var15._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1c0,ppVar17,ppVar16);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_170,ppVar17,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)__y);
                local_118.second.second.second._M_string_length =
                     local_170.second.second._M_string_length;
                local_118.second.first.second._M_string_length =
                     local_170.first.second._M_string_length;
                local_118.first.second.second._M_string_length =
                     local_1c0.second.second._M_string_length;
                local_118.first.first.second._M_string_length =
                     local_1c0.first.second._M_string_length;
                paVar1 = &local_1c0.first.second.field_2;
                local_118.first.first.first = local_1c0.first.first;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p == paVar1) {
                  local_118.first.first.second.field_2._8_8_ = local_1c0.first.second.field_2._8_8_;
                  local_118.first.first.second._M_dataplus._M_p = (pointer)ppVar6;
                }
                else {
                  local_118.first.first.second._M_dataplus._M_p =
                       local_1c0.first.second._M_dataplus._M_p;
                }
                local_118.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.first.second.field_2._M_local_buf[0] =
                     local_1c0.first.second.field_2._M_local_buf[0];
                local_1c0.first.second._M_string_length = 0;
                local_1c0.first.second.field_2._M_local_buf[0] = '\0';
                local_118.first.second.first = local_1c0.second.first;
                paVar14 = &local_1c0.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p == paVar14) {
                  local_118.first.second.second.field_2._8_8_ =
                       local_1c0.second.second.field_2._8_8_;
                  local_118.first.second.second._M_dataplus._M_p = (pointer)paVar20;
                }
                else {
                  local_118.first.second.second._M_dataplus._M_p =
                       local_1c0.second.second._M_dataplus._M_p;
                }
                local_118.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1c0.second.second.field_2._M_allocated_capacity._1_7_;
                local_118.first.second.second.field_2._M_local_buf[0] =
                     local_1c0.second.second.field_2._M_local_buf[0];
                paVar4 = &local_170.first.second.field_2;
                local_1c0.second.second._M_string_length = 0;
                local_1c0.second.second.field_2._M_local_buf[0] = '\0';
                local_118.second.first.first = local_170.first.first;
                local_118.second.first.second._M_dataplus._M_p =
                     (pointer)((long)&local_118.second.first.second + 0x10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p == paVar4) {
                  local_118.second.first.second.field_2._8_8_ = local_170.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_118.second.first.second._M_dataplus._M_p =
                       local_170.first.second._M_dataplus._M_p;
                }
                local_118.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_170.first.second.field_2._M_allocated_capacity._1_7_;
                local_118.second.first.second.field_2._M_local_buf[0] =
                     local_170.first.second.field_2._M_local_buf[0];
                local_170.first.second._M_string_length = 0;
                local_170.first.second.field_2._M_local_buf[0] = '\0';
                paVar2 = &local_170.second.second.field_2;
                local_118.second.second.first = local_170.second.first;
                local_118.second.second.second._M_dataplus._M_p = (pointer)local_120;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p == paVar2) {
                  local_120->_M_allocated_capacity =
                       CONCAT71(local_170.second.second.field_2._M_allocated_capacity._1_7_,
                                local_170.second.second.field_2._M_local_buf[0]);
                  *(undefined8 *)(local_120->_M_local_buf + 8) =
                       local_170.second.second.field_2._8_8_;
                }
                else {
                  local_118.second.second.second.field_2._M_allocated_capacity =
                       CONCAT71(local_170.second.second.field_2._M_allocated_capacity._1_7_,
                                local_170.second.second.field_2._M_local_buf[0]);
                  local_118.second.second.second._M_dataplus._M_p =
                       local_170.second.second._M_dataplus._M_p;
                }
                local_170.second.second._M_string_length = 0;
                local_170.second.second.field_2._M_local_buf[0] = '\0';
                local_1c0.first.second._M_dataplus._M_p = (pointer)paVar1;
                local_1c0.second.second._M_dataplus._M_p = (pointer)paVar14;
                local_170.first.second._M_dataplus._M_p = (pointer)paVar4;
                local_170.second.second._M_dataplus._M_p = (pointer)paVar2;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var15._M_head_impl)->clique_for_hom_non_edge_constraints,&local_118
                           ,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.second.second._M_dataplus._M_p != local_120) {
                  operator_delete(local_118.second.second.second._M_dataplus._M_p,
                                  local_118.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.second.first.second._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_118.second.first.second + 0x10U)) {
                  operator_delete(local_118.second.first.second._M_dataplus._M_p,
                                  local_118.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.first.second.second._M_dataplus._M_p != paVar20) {
                  operator_delete(local_118.first.second.second._M_dataplus._M_p,
                                  local_118.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)local_118.first.first.second._M_dataplus._M_p != ppVar6) {
                  operator_delete(local_118.first.first.second._M_dataplus._M_p,
                                  local_118.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.second.second._M_dataplus._M_p != &local_170.second.second.field_2)
                {
                  operator_delete(local_170.second.second._M_dataplus._M_p,
                                  CONCAT71(local_170.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.first.second._M_dataplus._M_p != &local_170.first.second.field_2) {
                  operator_delete(local_170.first.second._M_dataplus._M_p,
                                  CONCAT71(local_170.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_170.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.second.second._M_dataplus._M_p != &local_1c0.second.second.field_2)
                {
                  operator_delete(local_1c0.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                ppVar16 = local_70;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1c0.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1c0.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1c0.first.second.field_2._M_local_buf[0]) + 1
                                 );
                  ppVar16 = local_70;
                }
              }
              ppVar16 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar16);
            } while (ppVar16 != local_48);
          }
          local_78 = (_Base_ptr)std::_Rb_tree_increment(local_78);
        } while (local_78 != local_38);
      }
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 != local_40);
  }
  if (local_68 != (long *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

auto Proof::start_hom_clique_proof(const NamedVertex & p, vector<NamedVertex> && p_clique, const NamedVertex & t, map<int, NamedVertex> && t_clique_neighbourhood) -> void
{
    _imp->p_clique = move(p_clique);
    _imp->t_clique_neighbourhood = move(t_clique_neighbourhood);

    *_imp->proof_stream << "* hom clique objective\n";
    vector<long> to_sum;
    for (auto & q : _imp->p_clique) {
        *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
        for (auto & u : _imp->t_clique_neighbourhood)
            *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.second.first}];
        *_imp->proof_stream << " >= 1 ;\n";
        to_sum.push_back(++_imp->proof_line);
    }

    *_imp->proof_stream << "p";
    bool first = true;
    for (auto & t : to_sum) {
        *_imp->proof_stream << " " << t;
        if (! first)
            *_imp->proof_stream << " +";
        first = false;
    }
    *_imp->proof_stream << '\n';
    _imp->objective_line = ++_imp->proof_line;

    *_imp->proof_stream << "* hom clique non edges for injectivity\n";

    for (auto & p : _imp->p_clique)
        for (auto & q : _imp->p_clique)
            if (p != q) {
                for (auto & [_, t] : _imp->t_clique_neighbourhood) {
                    *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " 1 ~x" << _imp->variable_mappings[pair{q.first, t.first}] << " >= 1 ;\n";
                    ++_imp->proof_line;
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, t}, pair{q, t}}, _imp->proof_line);
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{q, t}, pair{p, t}}, _imp->proof_line);
                }
            }

    *_imp->proof_stream << "* hom clique non edges for variables\n";

    for (auto & p : _imp->p_clique)
        for (auto & [_, t] : _imp->t_clique_neighbourhood) {
            for (auto & [_, u] : _imp->t_clique_neighbourhood) {
                if (t != u) {
                    *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " 1 ~x" << _imp->variable_mappings[pair{p.first, u.first}] << " >= 1 ;\n";
                    ++_imp->proof_line;
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, t}, pair{p, u}}, _imp->proof_line);
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, u}, pair{p, t}}, _imp->proof_line);
                }
            }
        }
}